

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O2

string * deqp::gles3::Performance::anon_unknown_1::DeadCodeEliminationCase::
         deadBranchComplexCaseStatements
                   (string *__return_storage_ptr__,bool optimized,string *precision,bool useConst,
                   bool useHeavierWorkload)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000031;
  char *__s;
  undefined3 in_register_00000081;
  int numLoopIterations;
  string constMaybe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __s = "";
  if ((int)CONCAT71(in_register_00000009,useConst) != 0) {
    __s = "const ";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&constMaybe,__s,(allocator<char> *)&local_220);
  numLoopIterations = 4;
  if (CONCAT31(in_register_00000081,useHeavierWorkload) != 0) {
    numLoopIterations = 0x10;
  }
  if ((int)CONCAT71(in_register_00000031,optimized) == 0) {
    std::operator+(&local_1e0,"\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\t",&constMaybe);
    std::operator+(&local_1c0,&local_1e0,precision);
    std::operator+(&local_1a0,&local_1c0,
                   " vec4 a = vec4(sin(0.7), cos(0.2), sin(0.9), abs(-0.5));\n\t");
    std::operator+(&local_180,&local_1a0,&constMaybe);
    std::operator+(&local_160,&local_180,precision);
    std::operator+(&local_140,&local_160," vec4 b = cos(a) + fract(3.0*a.xzzw);\n\t");
    std::operator+(&local_120,&local_140,&constMaybe);
    std::operator+(&local_100,&local_120,"bvec4 c = bvec4(true, false, true, true);\n\t");
    std::operator+(&local_e0,&local_100,&constMaybe);
    std::operator+(&local_c0,&local_e0,precision);
    std::operator+(&local_a0,&local_c0," vec4 d = exp(b + vec4(c));\n\t");
    std::operator+(&local_80,&local_a0,&constMaybe);
    std::operator+(&local_60,&local_80,precision);
    std::operator+(&local_40,&local_60,
                   " vec4 e = 1.8*abs(sin(sin(inversesqrt(mix(d+a, d+b, a)))));\n\tif (e.x > 1.0)\n\t{\n\t\tvalue = cos(exp(sin(value))*log(sqrt(value)));\n\t\tfor (int i = 0; i < "
                  );
    de::toString<int>(&local_200,&numLoopIterations);
    std::operator+(&local_220,&local_40,&local_200);
    std::operator+(__return_storage_ptr__,&local_220,"; i++)\n\t\t\tvalue = sin(value);\n\t}\n");
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n",
               (allocator<char> *)&local_220);
  }
  std::__cxx11::string::~string((string *)&constMaybe);
  return __return_storage_ptr__;
}

Assistant:

static inline string deadBranchComplexCaseStatements (bool optimized, const string& precision, bool useConst, bool useHeavierWorkload)
	{
		const string	constMaybe			= useConst ? "const " : "";
		const int		numLoopIterations	= useHeavierWorkload ? 16 : 4;

		return optimized ?	"	value = vec4(0.6, 0.7, 0.8, 0.9) * value;\n"

						 :	"	value = vec4(0.6, 0.7, 0.8, 0.9) * value;\n"
							"	" + constMaybe + precision + " vec4 a = vec4(sin(0.7), cos(0.2), sin(0.9), abs(-0.5));\n"
							"	" + constMaybe + precision + " vec4 b = cos(a) + fract(3.0*a.xzzw);\n"
							"	" + constMaybe + "bvec4 c = bvec4(true, false, true, true);\n"
							"	" + constMaybe + precision + " vec4 d = exp(b + vec4(c));\n"
							"	" + constMaybe + precision + " vec4 e = 1.8*abs(sin(sin(inversesqrt(mix(d+a, d+b, a)))));\n"
							"	if (e.x > 1.0)\n"
							"	{\n"
							"		value = cos(exp(sin(value))*log(sqrt(value)));\n"
							"		for (int i = 0; i < " + toString(numLoopIterations) + "; i++)\n"
							"			value = sin(value);\n"
							"	}\n";
	}